

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

int GetExactSampleRate(snd_pcm_hw_params_t *hwParams,double *sampleRate)

{
  int iVar1;
  uint local_20;
  int err;
  uint den;
  uint num;
  double *sampleRate_local;
  snd_pcm_hw_params_t *hwParams_local;
  
  local_20 = 1;
  _den = sampleRate;
  sampleRate_local = (double *)hwParams;
  if (hwParams != (snd_pcm_hw_params_t *)0x0) {
    iVar1 = (*alsa_snd_pcm_hw_params_get_rate_numden)(hwParams,(uint *)&err,&local_20);
    *_den = (double)(uint)err / (double)local_20;
    return iVar1;
  }
  __assert_fail("hwParams",
                "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                ,0xc98,"int GetExactSampleRate(snd_pcm_hw_params_t *, double *)");
}

Assistant:

static int GetExactSampleRate( snd_pcm_hw_params_t *hwParams, double *sampleRate )
{
    unsigned int num, den = 1;
    int err;

    assert( hwParams );

    err = alsa_snd_pcm_hw_params_get_rate_numden( hwParams, &num, &den );
    *sampleRate = (double) num / den;

    return err;
}